

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssa_rewrite_pass.cpp
# Opt level: O3

uint32_t __thiscall
spvtools::opt::SSARewriter::AddPhiOperands(SSARewriter *this,PhiCandidate *phi_candidate)

{
  iterator *piVar1;
  pointer *pppPVar2;
  IRContext *pIVar3;
  CFG *this_00;
  Instruction *this_01;
  uint32_t *puVar4;
  iterator iVar5;
  _Elt_pointer ppPVar6;
  iterator __position;
  uint uVar7;
  uint32_t uVar8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar9;
  BasicBlock *bb;
  const_iterator cVar10;
  iterator iVar11;
  uint32_t *puVar12;
  uint32_t arg_id;
  PhiCandidate *local_60;
  uint local_54;
  BasicBlock *local_50;
  uint local_44;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::SSARewriter::PhiCandidate>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::SSARewriter::PhiCandidate>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_40;
  _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_38;
  
  local_60 = phi_candidate;
  if ((phi_candidate->phi_args_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (phi_candidate->phi_args_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    __assert_fail("phi_candidate->phi_args().size() == 0 && \"Phi candidate already has arguments\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/ssa_rewrite_pass.cpp"
                  ,0xa7,"uint32_t spvtools::opt::SSARewriter::AddPhiOperands(PhiCandidate *)");
  }
  pIVar3 = (this->pass_->super_Pass).context_;
  if ((pIVar3->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
    IRContext::BuildCFG(pIVar3);
  }
  this_00 = (pIVar3->cfg_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>._M_t
            .super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>.
            super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl;
  this_01 = (phi_candidate->bb_->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  uVar8 = 0;
  if (this_01->has_result_id_ == true) {
    uVar8 = Instruction::GetSingleWordOperand(this_01,(uint)this_01->has_type_id_);
  }
  pvVar9 = CFG::preds(this_00,uVar8);
  puVar12 = (pvVar9->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  puVar4 = (pvVar9->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar12 == puVar4) {
LAB_0053ab35:
    uVar8 = TryRemoveTrivialPhi(this,phi_candidate);
    if (uVar8 == local_60->result_id_) {
      local_60->is_complete_ = true;
      __position._M_current =
           (this->phis_to_generate_).
           super__Vector_base<spvtools::opt::SSARewriter::PhiCandidate_*,_std::allocator<spvtools::opt::SSARewriter::PhiCandidate_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->phis_to_generate_).
          super__Vector_base<spvtools::opt::SSARewriter::PhiCandidate_*,_std::allocator<spvtools::opt::SSARewriter::PhiCandidate_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<spvtools::opt::SSARewriter::PhiCandidate*,std::allocator<spvtools::opt::SSARewriter::PhiCandidate*>>
        ::_M_realloc_insert<spvtools::opt::SSARewriter::PhiCandidate*const&>
                  ((vector<spvtools::opt::SSARewriter::PhiCandidate*,std::allocator<spvtools::opt::SSARewriter::PhiCandidate*>>
                    *)&this->phis_to_generate_,__position,&local_60);
      }
      else {
        *__position._M_current = local_60;
        pppPVar2 = &(this->phis_to_generate_).
                    super__Vector_base<spvtools::opt::SSARewriter::PhiCandidate_*,_std::allocator<spvtools::opt::SSARewriter::PhiCandidate_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppPVar2 = *pppPVar2 + 1;
      }
    }
  }
  else {
    local_38 = &(this->sealed_blocks_)._M_h;
    local_40 = &(this->phi_candidates_)._M_h;
    uVar7 = 0;
    do {
      while( true ) {
        local_44 = uVar7;
        uVar8 = *puVar12;
        pIVar3 = (this->pass_->super_Pass).context_;
        if ((pIVar3->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
          IRContext::BuildCFG(pIVar3);
        }
        bb = CFG::block((pIVar3->cfg_)._M_t.
                        super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>
                        .super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl,uVar8);
        local_50 = bb;
        cVar10 = std::
                 _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::find(local_38,&local_50);
        if (cVar10.super__Node_iterator_base<spvtools::opt::BasicBlock_*,_false>._M_cur ==
            (__node_type *)0x0) {
          local_54 = 0;
        }
        else {
          local_54 = GetReachingDef(this,local_60->var_id_,bb);
        }
        iVar5._M_current =
             (local_60->phi_args_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (local_60->phi_args_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_60->phi_args_,iVar5
                     ,&local_54);
        }
        else {
          *iVar5._M_current = local_54;
          (local_60->phi_args_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
        }
        if (local_54 == 0) break;
        local_50 = (BasicBlock *)CONCAT44(local_50._4_4_,local_54);
        iVar11 = std::
                 _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::SSARewriter::PhiCandidate>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::SSARewriter::PhiCandidate>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(local_40,(key_type *)&local_50);
        if ((iVar11.
             super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::SSARewriter::PhiCandidate>,_false>
             ._M_cur != (__node_type *)0x0) &&
           ((PhiCandidate *)
            ((long)iVar11.
                   super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::SSARewriter::PhiCandidate>,_false>
                   ._M_cur + 0x10) != local_60)) {
          local_50 = (BasicBlock *)CONCAT44(local_50._4_4_,local_60->result_id_);
          iVar5._M_current =
               *(uint **)((long)iVar11.
                                super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::SSARewriter::PhiCandidate>,_false>
                                ._M_cur + 0x48);
          if (iVar5._M_current ==
              *(uint **)((long)iVar11.
                               super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::SSARewriter::PhiCandidate>,_false>
                               ._M_cur + 0x50)) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                       ((long)iVar11.
                              super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::SSARewriter::PhiCandidate>,_false>
                              ._M_cur + 0x40),iVar5,(uint *)&local_50);
          }
          else {
            *iVar5._M_current = local_60->result_id_;
            *(uint **)((long)iVar11.
                             super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::SSARewriter::PhiCandidate>,_false>
                             ._M_cur + 0x48) = iVar5._M_current + 1;
          }
        }
        puVar12 = puVar12 + 1;
        uVar7 = local_44;
        if (puVar12 == puVar4) {
          phi_candidate = local_60;
          if ((local_44 & 1) == 0) goto LAB_0053ab35;
          goto LAB_0053ab0b;
        }
      }
      puVar12 = puVar12 + 1;
      uVar7 = 1;
    } while (puVar12 != puVar4);
LAB_0053ab0b:
    local_60->is_complete_ = false;
    ppPVar6 = (this->incomplete_phis_).c.
              super__Deque_base<spvtools::opt::SSARewriter::PhiCandidate_*,_std::allocator<spvtools::opt::SSARewriter::PhiCandidate_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppPVar6 ==
        (this->incomplete_phis_).c.
        super__Deque_base<spvtools::opt::SSARewriter::PhiCandidate_*,_std::allocator<spvtools::opt::SSARewriter::PhiCandidate_*>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      std::
      deque<spvtools::opt::SSARewriter::PhiCandidate*,std::allocator<spvtools::opt::SSARewriter::PhiCandidate*>>
      ::_M_push_back_aux<spvtools::opt::SSARewriter::PhiCandidate*const&>
                ((deque<spvtools::opt::SSARewriter::PhiCandidate*,std::allocator<spvtools::opt::SSARewriter::PhiCandidate*>>
                  *)&this->incomplete_phis_,&local_60);
    }
    else {
      *ppPVar6 = local_60;
      piVar1 = &(this->incomplete_phis_).c.
                super__Deque_base<spvtools::opt::SSARewriter::PhiCandidate_*,_std::allocator<spvtools::opt::SSARewriter::PhiCandidate_*>_>
                ._M_impl.super__Deque_impl_data._M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
    }
    uVar8 = local_60->result_id_;
  }
  return uVar8;
}

Assistant:

uint32_t SSARewriter::AddPhiOperands(PhiCandidate* phi_candidate) {
  assert(phi_candidate->phi_args().size() == 0 &&
         "Phi candidate already has arguments");

  bool found_0_arg = false;
  for (uint32_t pred : pass_->cfg()->preds(phi_candidate->bb()->id())) {
    BasicBlock* pred_bb = pass_->cfg()->block(pred);

    // If |pred_bb| is not sealed, use %0 to indicate that
    // |phi_candidate| needs to be completed after the whole CFG has
    // been processed.
    //
    // Note that we cannot call GetReachingDef() in these cases
    // because this would generate an empty Phi candidate in
    // |pred_bb|.  When |pred_bb| is later processed, a new definition
    // for |phi_candidate->var_id_| will be lost because
    // |phi_candidate| will still be reached by the empty Phi.
    //
    // Consider:
    //
    //       BB %23:
    //           %38 = Phi[%i](%int_0[%1], %39[%25])
    //
    //           ...
    //
    //       BB %25: [Starts unsealed]
    //       %39 = Phi[%i]()
    //       %34 = ...
    //       OpStore %i %34    -> Currdef(%i) at %25 is %34
    //       OpBranch %23
    //
    // When we first create the Phi in %38, we add an operandless Phi in
    // %39 to hold the unknown reaching def for %i.
    //
    // But then, when we go to complete %39 at the end.  The reaching def
    // for %i in %25's predecessor is %38 itself.  So we miss the fact
    // that %25 has a def for %i that should be used.
    //
    // By making the argument %0, we make |phi_candidate| incomplete,
    // which will cause it to be completed after the whole CFG has
    // been scanned.
    uint32_t arg_id = IsBlockSealed(pred_bb)
                          ? GetReachingDef(phi_candidate->var_id(), pred_bb)
                          : 0;
    phi_candidate->phi_args().push_back(arg_id);

    if (arg_id == 0) {
      found_0_arg = true;
    } else {
      // If this argument is another Phi candidate, add |phi_candidate| to the
      // list of users for the defining Phi.
      PhiCandidate* defining_phi = GetPhiCandidate(arg_id);
      if (defining_phi && defining_phi != phi_candidate) {
        defining_phi->AddUser(phi_candidate->result_id());
      }
    }
  }

  // If we could not fill-in all the arguments of this Phi, mark it incomplete
  // so it gets completed after the whole CFG has been processed.
  if (found_0_arg) {
    phi_candidate->MarkIncomplete();
    incomplete_phis_.push(phi_candidate);
    return phi_candidate->result_id();
  }

  // Try to remove |phi_candidate|, if it's trivial.
  uint32_t repl_id = TryRemoveTrivialPhi(phi_candidate);
  if (repl_id == phi_candidate->result_id()) {
    // |phi_candidate| is complete and not trivial.  Add it to the
    // list of Phi candidates to generate.
    phi_candidate->MarkComplete();
    phis_to_generate_.push_back(phi_candidate);
  }

  return repl_id;
}